

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamRedirect::StreamRedirect(StreamRedirect *this,ostream *stream,string *targetString)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  uVar2 = std::ios::rdbuf();
  in_RDI[1] = uVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 2));
  in_RDI[0x31] = in_RDX;
  lVar1 = *(long *)(*in_RSI + -0x18);
  std::__cxx11::ostringstream::rdbuf();
  std::ios::rdbuf((streambuf *)((long)in_RSI + lVar1));
  return;
}

Assistant:

StreamRedirect( std::ostream& stream, std::string& targetString )
        :   m_stream( stream ),
            m_prevBuf( stream.rdbuf() ),
            m_targetString( targetString )
        {
            stream.rdbuf( m_oss.rdbuf() );
        }